

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O3

void tcg_gen_gvec_4_ptr_m68k
               (TCGContext_conflict2 *tcg_ctx,uint32_t dofs,uint32_t aofs,uint32_t bofs,
               uint32_t cofs,TCGv_ptr ptr,uint32_t oprsz,uint32_t maxsz,int32_t data,undefined1 *fn)

{
  uint32_t val;
  TCGv_i32 pTVar1;
  TCGTemp *ts;
  TCGTemp *ts_00;
  TCGTemp *ts_01;
  TCGTemp *ts_02;
  uintptr_t o;
  
  val = simd_desc_m68k(oprsz,maxsz,data);
  pTVar1 = tcg_const_i32_m68k(tcg_ctx,val);
  ts = tcg_temp_new_internal_m68k(tcg_ctx,TCG_TYPE_I64,false);
  ts_00 = tcg_temp_new_internal_m68k(tcg_ctx,TCG_TYPE_I64,false);
  ts_01 = tcg_temp_new_internal_m68k(tcg_ctx,TCG_TYPE_I64,false);
  ts_02 = tcg_temp_new_internal_m68k(tcg_ctx,TCG_TYPE_I64,false);
  tcg_gen_addi_i64_m68k
            (tcg_ctx,(TCGv_i64)((long)ts - (long)tcg_ctx),(TCGv_i64)tcg_ctx->cpu_env,(ulong)dofs);
  tcg_gen_addi_i64_m68k
            (tcg_ctx,(TCGv_i64)((long)ts_00 - (long)tcg_ctx),(TCGv_i64)tcg_ctx->cpu_env,(ulong)aofs)
  ;
  tcg_gen_addi_i64_m68k
            (tcg_ctx,(TCGv_i64)((long)ts_01 - (long)tcg_ctx),(TCGv_i64)tcg_ctx->cpu_env,(ulong)bofs)
  ;
  tcg_gen_addi_i64_m68k
            (tcg_ctx,(TCGv_i64)((long)ts_02 - (long)tcg_ctx),(TCGv_i64)tcg_ctx->cpu_env,(ulong)cofs)
  ;
  (*(code *)fn)(tcg_ctx,(TCGv_i64)((long)ts - (long)tcg_ctx),(TCGv_i64)((long)ts_00 - (long)tcg_ctx)
                ,(TCGv_i64)((long)ts_01 - (long)tcg_ctx),(TCGv_i64)((long)ts_02 - (long)tcg_ctx),ptr
                ,pTVar1);
  tcg_temp_free_internal_m68k(tcg_ctx,ts);
  tcg_temp_free_internal_m68k(tcg_ctx,ts_00);
  tcg_temp_free_internal_m68k(tcg_ctx,ts_01);
  tcg_temp_free_internal_m68k(tcg_ctx,ts_02);
  tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(pTVar1 + (long)tcg_ctx));
  return;
}

Assistant:

void tcg_gen_gvec_4_ptr(TCGContext *tcg_ctx, uint32_t dofs, uint32_t aofs, uint32_t bofs,
                        uint32_t cofs, TCGv_ptr ptr, uint32_t oprsz,
                        uint32_t maxsz, int32_t data,
                        gen_helper_gvec_4_ptr *fn)
{
    TCGv_ptr a0, a1, a2, a3;
    TCGv_i32 desc = tcg_const_i32(tcg_ctx, simd_desc(oprsz, maxsz, data));

    a0 = tcg_temp_new_ptr(tcg_ctx);
    a1 = tcg_temp_new_ptr(tcg_ctx);
    a2 = tcg_temp_new_ptr(tcg_ctx);
    a3 = tcg_temp_new_ptr(tcg_ctx);

    tcg_gen_addi_ptr(tcg_ctx, a0, tcg_ctx->cpu_env, dofs);
    tcg_gen_addi_ptr(tcg_ctx, a1, tcg_ctx->cpu_env, aofs);
    tcg_gen_addi_ptr(tcg_ctx, a2, tcg_ctx->cpu_env, bofs);
    tcg_gen_addi_ptr(tcg_ctx, a3, tcg_ctx->cpu_env, cofs);

    fn(tcg_ctx, a0, a1, a2, a3, ptr, desc);

    tcg_temp_free_ptr(tcg_ctx, a0);
    tcg_temp_free_ptr(tcg_ctx, a1);
    tcg_temp_free_ptr(tcg_ctx, a2);
    tcg_temp_free_ptr(tcg_ctx, a3);
    tcg_temp_free_i32(tcg_ctx, desc);
}